

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAddons.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Elt_pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (string *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (string *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  if (1 < argc) {
    uVar9 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,argv[uVar9],&local_a9);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 &local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      uVar9 = uVar9 + 1;
    } while ((uint)argc != uVar9);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    bVar4 = false;
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar4 = false;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
      if (iVar5 == 0) {
        bVar3 = true;
      }
      bVar2 = hasInfo(local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
      pbVar1 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (bVar2) {
        bVar4 = true;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
      if ((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)pbVar1), iVar5 == 0)) ||
          (iVar5 = std::__cxx11::string::compare((char *)pbVar1), iVar5 == 0)) ||
         (iVar5 = std::__cxx11::string::compare((char *)pbVar1), iVar5 == 0)) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88);
        getGpuID((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if (bVar3) {
    uVar7 = 0;
    debugTest();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------",0x45);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"          Tasmanian Addons Module: Functionality Test",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------",0x45);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    plVar6 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    bVar3 = testConstructSurrogate(bVar4);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) = 0x28;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Automated construction",0x16);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) = 10;
    pcVar10 = "FAIL";
    pcVar8 = "FAIL";
    if (bVar3) {
      pcVar8 = "Pass";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) = 0x28;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unstructured construction",0x19);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    bVar4 = testNodeAndWeightSizes();
    if ((bVar4) && (bVar4 = testBasicAttributes(), bVar4)) {
      bVar4 = testAccuracy();
    }
    else {
      bVar4 = false;
    }
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) = 0x28;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exotic quadrature",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) = 10;
    pcVar8 = "FAIL";
    if (bVar4 != false) {
      pcVar8 = "Pass";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    bVar2 = testGetSubrules();
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) = 0x28;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CustomTabulated manipulation",0x1c);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) = 10;
    if (bVar2) {
      pcVar10 = "Pass";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "---------------------------------------------------------------------",0x45);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"               All Tests Completed Successfully",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "---------------------------------------------------------------------",0x45);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL",0x45);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"         Some Tests Have Failed",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL",0x45);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    }
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    uVar7 = (uint)(byte)(bVar3 & bVar4 & bVar2 ^ 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  return uVar7;
}

Assistant:

int main(int argc, char const **argv){

    std::deque<std::string> args = stringArgs(argc, argv);

    bool debug = false;
    bool pass_all = true;
    bool verbose = false;
    int gpuid = -1;

    while(not args.empty()){
        if (args.front() == "debug") debug = true;
        if (hasInfo(args.front())) verbose = true;
        if (hasGpuID(args.front())){
            args.pop_front();
            gpuid = getGpuID(args);
        }
        args.pop_front();
    }

    if (debug){
        debugTest();
        return 0;
    }

    cout << "\n\n";
    cout << "---------------------------------------------------------------------" << endl;
    cout << "          Tasmanian Addons Module: Functionality Test" << endl;
    cout << "---------------------------------------------------------------------" << endl << endl;

    bool pass = testConstructSurrogate(verbose);
    cout << std::setw(40) << "Automated construction" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    #if defined(Tasmanian_ENABLE_BLAS) || defined(Tasmanian_ENABLE_GPU)
    pass = true;
    pass = testLoadUnstructuredL2(verbose, gpuid);
    cout << std::setw(40) << "Unstructured construction" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;
    #else
    cout << std::setw(40) << "Unstructured construction" << std::setw(10) << "skipping" << endl;
    gpuid *= 2; // no op to register the use of gpuid
    #endif

    // Tests for Exotic Quadrature.
    pass = true;
    pass = testExoticQuadrature();
    cout << std::setw(40) << "Exotic quadrature" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    // Tests for manipulating CustomTabulated objects.
    pass = true;
    pass = testCustomTabulated();
    cout << std::setw(40) << "CustomTabulated manipulation" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    cout << "\n";
    if (pass){
        cout << "---------------------------------------------------------------------" << endl;
        cout << "               All Tests Completed Successfully" << endl;
        cout << "---------------------------------------------------------------------" << endl << endl;
    }else{
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl;
        cout << "         Some Tests Have Failed" << endl;
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl << endl;
    }

    return ((pass_all) ? 0 : 1);

}